

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O1

void __thiscall
module_level_csv_actions::module2(module_level_csv_actions *this,string *module,int level)

{
  ostream *poVar1;
  
  if (this->module2_start_ == true) {
    this->module2_start_ = false;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(module->_M_dataplus)._M_p,module->_M_string_length);
  if (level < 0x3fffffff) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,level);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    return;
  }
  return;
}

Assistant:

void module2( std::string const & module, int level )
    {
        if( module2_start_ )
        {
            module2_start_ = false;
        }
        else
        {
            std::cout << " ";
        }

        std::cout << module;

        if( level < unknown_level )
        {
            std::cout << "(" << level << ")";
        }
    }